

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall BailOutRecord::DumpLocalOffsets(BailOutRecord *this,uint count,int argOutSlotStart)

{
  anon_class_16_2_3f8e8a0c callback;
  char16 *name;
  int argOutSlotStart_local;
  uint count_local;
  BailOutRecord *this_local;
  
  callback.this = this;
  callback.name = L"Register";
  GlobalBailOutRecordDataTable::
  IterateGlobalBailOutRecordTableRows<BailOutRecord::DumpLocalOffsets(unsigned_int,int)::__0>
            (this->globalBailOutRecordTable,this->m_bailOutRecordId,callback);
  return;
}

Assistant:

void BailOutRecord::DumpLocalOffsets(uint count, int argOutSlotStart)
{
    char16 const * name = _u("Register");
    globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
        Assert(row != nullptr);

        // The variables below determine whether we have a Var or native float/int.
        bool isFloat64 = row->isFloat;
        bool isInt32 = row->isInt;
        Assert(!isFloat64 || !isInt32);

        Output::Print(_u("%s #%3d: "), name, row->regSlot);
        this->DumpValue(row->offset, isFloat64);
        Output::Print(_u("\n"));
    });
}